

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bplustree.cpp
# Opt level: O0

void __thiscall BPlusTree::PrintNode(BPlusTree *this,shared_ptr<Node> *node)

{
  element_type *peVar1;
  size_type sVar2;
  __shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  ostream *poVar5;
  reference pvVar6;
  element_type *this_00;
  int local_1c;
  int i;
  shared_ptr<Node> *node_local;
  BPlusTree *this_local;
  
  std::operator<<((ostream *)&std::cout,"[");
  local_1c = 0;
  while( true ) {
    peVar1 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)node)
    ;
    sVar2 = std::vector<float,_std::allocator<float>_>::size(&peVar1->keys);
    if (sVar2 <= (ulong)(long)local_1c) break;
    peVar1 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)node)
    ;
    p_Var3 = &std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::
              operator[](&peVar1->ptrs,(long)local_1c)->
              super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>;
    pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,p_Var3);
    poVar5 = std::operator<<(pbVar4,"|");
    peVar1 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)node)
    ;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](&peVar1->keys,(long)local_1c);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar6);
    std::operator<<(poVar5,"|");
    local_1c = local_1c + 1;
  }
  peVar1 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)node);
  this_00 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)node);
  sVar2 = std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::size
                    (&this_00->ptrs);
  p_Var3 = &std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::operator[]
                      (&peVar1->ptrs,sVar2 - 1)->
            super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>;
  pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,p_Var3);
  poVar5 = std::operator<<(pbVar4,"]");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void BPlusTree::PrintNode(std::shared_ptr<Node> node) {
    std::cout << "[";
    for (int i = 0; i < node->keys.size(); i++) {
        std::cout << node->ptrs[i] << "|" << node->keys[i]<< "|";
    }
    std::cout << node->ptrs[node->ptrs.size()-1] << "]" << std::endl;
}